

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

raw_ostream * __thiscall llvm::raw_ostream::write_zeros(raw_ostream *this,uint NumZeros)

{
  raw_ostream *prVar1;
  size_t in_RCX;
  void *__buf;
  
  if (0x4f < NumZeros) {
    do {
      __buf = (void *)0x4f;
      if (NumZeros < 0x4f) {
        __buf = (void *)(ulong)NumZeros;
      }
      write(this,0xe85370,__buf,in_RCX);
      NumZeros = NumZeros - (int)__buf;
    } while (NumZeros != 0);
    return this;
  }
  prVar1 = (raw_ostream *)write(this,0xe85370,(void *)(ulong)NumZeros,in_RCX);
  return prVar1;
}

Assistant:

raw_ostream &raw_ostream::write_zeros(unsigned NumZeros) {
  return write_padding<'\0'>(*this, NumZeros);
}